

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

ostream * operator<<(ostream *os,Graph<Node> *g)

{
  Graph<Node> *this;
  int iVar1;
  ostream *poVar2;
  undefined1 local_4c [12];
  undefined1 local_40 [24];
  undefined1 local_28 [20];
  int i;
  Graph<Node> *g_local;
  ostream *os_local;
  
  unique0x100001f2 = g;
  g_local = (Graph<Node> *)os;
  std::operator<<(os,"Graph:\n\n");
  poVar2 = (ostream *)std::ostream::operator<<(g_local,stack0xffffffffffffffe8->_nodeCnt);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,stack0xffffffffffffffe8->_edgeCnt);
  std::operator<<(poVar2,'\n');
  for (local_28._12_4_ = 0; this = g_local, (int)local_28._12_4_ < stack0xffffffffffffffe8->_edgeCnt
      ; local_28._12_4_ = local_28._12_4_ + 1) {
    Graph<Node>::getEdge((Graph<Node> *)local_28,&stack0xffffffffffffffe8->_nodeCnt);
    iVar1 = Edge::getSource((Edge *)local_28);
    poVar2 = (ostream *)std::ostream::operator<<(this,iVar1);
    poVar2 = std::operator<<(poVar2,' ');
    Graph<Node>::getEdge((Graph<Node> *)local_40,&stack0xffffffffffffffe8->_nodeCnt);
    iVar1 = Edge::getDest((Edge *)local_40);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,' ');
    Graph<Node>::getEdge((Graph<Node> *)local_4c,&stack0xffffffffffffffe8->_nodeCnt);
    iVar1 = Edge::getCost((Edge *)local_4c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::operator<<(poVar2,'\n');
    Edge::~Edge((Edge *)local_4c);
    Edge::~Edge((Edge *)local_40);
    Edge::~Edge((Edge *)local_28);
  }
  std::operator<<((ostream *)g_local,"------------------------\n\n");
  return (ostream *)g_local;
}

Assistant:

std::ostream &operator << (std::ostream &os, const Graph <NodeT> &g) {
        os << "Graph:\n\n";
        os << g._nodeCnt << ' ' << g._edgeCnt << '\n';
        for (int i = 0; i < g._edgeCnt; ++i) {
            os << g.getEdge(i).getSource() << ' ' << g.getEdge(i).getDest() << ' ' << g.getEdge(i).getCost() << '\n';
        }

        os << "------------------------\n\n";
        return os;
    }